

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * __thiscall
QUtil::int_to_string_base_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,longlong num,int base,int length)

{
  int iVar1;
  ostream *poVar2;
  unsigned_long uVar3;
  logic_error *this_00;
  uint uVar4;
  int iVar5;
  locale alStack_1e8 [8];
  string cvt;
  string local_1c0 [32];
  ostringstream buf;
  undefined4 uStack_19c;
  
  uVar4 = (uint)num;
  if ((uVar4 < 0x11) && ((0x10500U >> (uVar4 & 0x1f) & 1) != 0)) {
    cvt._M_dataplus._M_p = (pointer)&cvt.field_2;
    cvt._M_string_length = 0;
    cvt.field_2._M_local_buf[0] = '\0';
    if (uVar4 == 10) {
      std::__cxx11::to_string((string *)&buf,(longlong)this);
      std::__cxx11::string::operator=((string *)&cvt,(string *)&buf);
      std::__cxx11::string::~string((string *)&buf);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
      std::locale::classic();
      std::ios::imbue(alStack_1e8);
      std::locale::~locale(alStack_1e8);
      poVar2 = std::operator<<(&buf,num & 0xffffffff);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffbfff;
      std::ostream::_M_insert<long_long>((longlong)poVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&cvt,local_1c0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    _buf = (pointer)cvt._M_string_length;
    iVar1 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&buf);
    if ((base - iVar1 != 0 && iVar1 <= base) && 0 < base) {
      _buf = base - iVar1;
      uVar3 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)&buf);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)uVar3);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    if ((base < 0) && (iVar5 = -base - iVar1, iVar5 != 0 && iVar1 <= -base)) {
      _buf = iVar5;
      uVar3 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)&buf);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,(char)uVar3);
    }
    std::__cxx11::string::~string((string *)&cvt);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"int_to_string_base called with unsupported base");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static std::string
int_to_string_base_internal(T num, int base, int length)
{
    // Backward compatibility -- int_to_string, which calls this function, used to use sprintf with
    // %0*d, so we interpret length such that a negative value appends spaces and a positive value
    // prepends zeroes.
    if (!((base == 8) || (base == 10) || (base == 16))) {
        throw std::logic_error("int_to_string_base called with unsupported base");
    }
    std::string cvt;
    if (base == 10) {
        // Use the more efficient std::to_string when possible
        cvt = std::to_string(num);
    } else {
        std::ostringstream buf;
        buf.imbue(std::locale::classic());
        buf << std::setbase(base) << std::nouppercase << num;
        cvt = buf.str();
    }
    std::string result;
    int str_length = QIntC::to_int(cvt.length());
    if ((length > 0) && (str_length < length)) {
        result.append(QIntC::to_size(length - str_length), '0');
    }
    result += cvt;
    if ((length < 0) && (str_length < -length)) {
        result.append(QIntC::to_size(-length - str_length), ' ');
    }
    return result;
}